

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ConditionalExpression::fromSyntax
          (Compilation *comp,ConditionalExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  bool bVar1;
  Compilation *expr;
  Expression *args_3;
  Expression *args_2;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ConditionalPredicateSyntax *pCVar8;
  Pattern *this;
  Type *pTVar9;
  undefined4 extraout_var;
  SVInt *this_00;
  ExpressionSyntax *pEVar10;
  ConditionalExpression *args;
  undefined4 extraout_var_00;
  SourceLocation location;
  Diagnostic *diag_00;
  Diagnostic *diag_01;
  EVP_PKEY_CTX *src;
  bool bVar11;
  iterator iVar12;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  bool local_422;
  bool local_3db;
  Diagnostic *diag;
  Type *local_2f0;
  Type *local_2e8;
  Type *local_2e0;
  Type *local_2d8;
  Type *local_2d0;
  Type *common;
  Type *local_2c0;
  Type *local_2b8;
  Type *local_2b0;
  Type *local_2a8;
  Type *local_2a0;
  byte local_295;
  undefined4 local_294;
  undefined1 auStack_290 [3];
  bool good;
  SourceLocation local_288;
  span<slang::ast::ConditionalExpression::Condition,_18446744073709551615UL> local_280;
  Compilation *local_270;
  ConditionalExpression *result;
  Type *resultType;
  Type *rt;
  Type *lt;
  Expression *local_248;
  Expression *right;
  Expression *local_238;
  Expression *left;
  bitmask<slang::ast::ASTFlags> local_228;
  bitmask<slang::ast::ASTFlags> local_220;
  bitmask<slang::ast::ASTFlags> local_218;
  bitmask<slang::ast::ASTFlags> local_210;
  bitmask<slang::ast::ASTFlags> local_208;
  bitmask<slang::ast::ASTFlags> local_200;
  bitmask<slang::ast::ASTFlags> rightFlags;
  bitmask<slang::ast::ASTFlags> leftFlags;
  Condition local_1e8;
  undefined1 local_1d8 [8];
  ConstantValue condVal;
  VarMap patternVarMap;
  Pattern *pattern;
  Expression *local_f0;
  Expression *cond;
  ConditionalPatternSyntax *condSyntax;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *__range2;
  ASTContext trueContext;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> conditions;
  bool isFourState;
  bool isTrue;
  bool isConst;
  bool bad;
  Type *assignmentTarget_local;
  ASTContext *context_local;
  ConditionalExpressionSyntax *syntax_local;
  Compilation *comp_local;
  
  bVar3 = false;
  bVar5 = true;
  bVar1 = true;
  bVar6 = false;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL>::SmallVector
            ((SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> *)
             &trueContext.assertionInstance);
  trueContext.randomizeDetails = (RandomizeDetails *)context->assertionInstance;
  __range2 = (SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)(context->scope).ptr;
  trueContext.scope.ptr = *(Scope **)&context->lookupIndex;
  trueContext._8_8_ = (context->flags).m_bits;
  trueContext.flags.m_bits = (underlying_type)context->instanceOrProc;
  trueContext.instanceOrProc = (Symbol *)context->firstTempVar;
  trueContext.firstTempVar = (TempVarSymbol *)context->randomizeDetails;
  pCVar8 = not_null<slang::syntax::ConditionalPredicateSyntax_*>::operator->(&syntax->predicate);
  iVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::begin
                     (&pCVar8->conditions);
  __end2.index = (size_t)iVar12.list;
  iVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::end
                     (&pCVar8->conditions);
  while( true ) {
    __end2.list = (ParentList *)iVar12.index;
    condSyntax = (ConditionalPatternSyntax *)iVar12.list;
    bVar2 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ConditionalPatternSyntax_*,_unsigned_long,_slang::syntax::ConditionalPatternSyntax_**,_slang::syntax::ConditionalPatternSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ConditionalPatternSyntax_*,_unsigned_long,_slang::syntax::ConditionalPatternSyntax_**,_slang::syntax::ConditionalPatternSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::ConditionalPatternSyntax_*> *)&condSyntax);
    if (!bVar2) break;
    cond = (Expression *)
           slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::
           iterator_base<slang::syntax::ConditionalPatternSyntax_*>::operator*
                     ((iterator_base<slang::syntax::ConditionalPatternSyntax_*> *)&__end2.index);
    pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                        ((not_null<slang::syntax::ExpressionSyntax_*> *)&cond->constant);
    bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&pattern,None);
    local_f0 = Expression::selfDetermined
                         (comp,pEVar10,(ASTContext *)&__range2,
                          (bitmask<slang::ast::ASTFlags>)pattern);
    bVar2 = Expression::bad(local_f0);
    bVar11 = bVar3 || bVar2;
    patternVarMap.
    super_flat_hash_map<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
    .
    super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
    .num_elements = 0;
    if (cond->syntax == (ExpressionSyntax *)0x0) {
      pTVar9 = not_null<const_slang::ast::Type_*>::operator->(&local_f0->type);
      bVar4 = Type::isFourState(pTVar9);
      bVar6 = bVar6 != false || bVar4;
      bVar4 = !bVar3;
      bVar3 = bVar11;
      if ((bVar4 && !bVar2) &&
         (bVar2 = ASTContext::requireBooleanConvertible((ASTContext *)&__range2,local_f0), !bVar2))
      {
        bVar3 = true;
      }
    }
    else {
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
      ::SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
                  *)((long)&condVal.value.
                            super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            .
                            super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                    + 0x20));
      this = (Pattern *)
             not_null<slang::syntax::PatternSyntax_*>::operator*
                       ((not_null<slang::syntax::PatternSyntax_*> *)(cond->syntax + 2));
      pTVar9 = not_null<const_slang::ast::Type_*>::operator*(&local_f0->type);
      iVar7 = Pattern::bind(this,(int)pTVar9,
                            (sockaddr *)
                            ((long)&condVal.value.
                                    super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                    .
                                    super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                            + 0x20),(socklen_t)&__range2);
      patternVarMap.
      super_flat_hash_map<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
      .
      super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
      .num_elements = CONCAT44(extraout_var,iVar7);
      bVar5 = false;
      bVar3 = Pattern::bad((Pattern *)
                           patternVarMap.
                           super_flat_hash_map<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
                           .
                           super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
                           .num_elements);
      SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
      ::~SmallMap((SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*,_4UL,_ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
                   *)((long)&condVal.value.
                             super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                             .
                             super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     + 0x20));
      bVar3 = bVar11 || bVar3;
    }
    if ((!bVar3) && (bVar5)) {
      ASTContext::tryEval((ConstantValue *)local_1d8,(ASTContext *)&__range2,local_f0);
      bVar2 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)local_1d8);
      if (bVar2) {
        bVar2 = slang::ConstantValue::isInteger((ConstantValue *)local_1d8);
        if (bVar2) {
          this_00 = slang::ConstantValue::integer((ConstantValue *)local_1d8);
          bVar2 = SVInt::hasUnknown(this_00);
          if (bVar2) goto LAB_0068bdb3;
        }
        bVar2 = slang::ConstantValue::isTrue((ConstantValue *)local_1d8);
        if (!bVar2) {
          bVar1 = false;
        }
      }
      else {
LAB_0068bdb3:
        bVar5 = false;
      }
      slang::ConstantValue::~ConstantValue((ConstantValue *)local_1d8);
    }
    leftFlags.m_bits = (underlying_type)local_f0;
    not_null<slang::ast::Expression_const*>::not_null<slang::ast::Expression*,void>
              ((not_null<slang::ast::Expression_const*> *)&local_1e8,(Expression **)&leftFlags);
    local_1e8.pattern =
         (Pattern *)
         patternVarMap.
         super_flat_hash_map<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*,_std::hash<basic_string_view<char,_char_traits<char>_>_>,_std::equal_to<basic_string_view<char,_char_traits<char>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
         .
         super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::PatternVarSymbol_*>_>,_4UL>_>
         .num_elements;
    SmallVectorBase<slang::ast::ConditionalExpression::Condition>::push_back
              ((SmallVectorBase<slang::ast::ConditionalExpression::Condition> *)
               &trueContext.assertionInstance,&local_1e8);
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ConditionalPatternSyntax_*,_unsigned_long,_slang::syntax::ConditionalPatternSyntax_**,_slang::syntax::ConditionalPatternSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::iterator_base<slang::syntax::ConditionalPatternSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ConditionalPatternSyntax_*,_unsigned_long,_slang::syntax::ConditionalPatternSyntax_**,_slang::syntax::ConditionalPatternSyntax_*&>
                  *)&__end2.index);
    iVar12.index = (size_t)__end2.list;
    iVar12.list = (ParentList *)condSyntax;
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&rightFlags,None);
  bitmask<slang::ast::ASTFlags>::bitmask(&local_200,None);
  if (bVar5) {
    if (bVar1) {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_208,UnevaluatedBranch);
      local_200.m_bits = local_208.m_bits;
    }
    else {
      bitmask<slang::ast::ASTFlags>::bitmask(&local_210,UnevaluatedBranch);
      rightFlags.m_bits = local_210.m_bits;
    }
  }
  bitmask<slang::ast::ASTFlags>::bitmask(&local_218,AllowUnboundedLiteral);
  bVar5 = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_218);
  local_3db = false;
  if (bVar5) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_220,AllowUnboundedLiteralArithmetic);
    local_3db = bitmask<slang::ast::ASTFlags>::has(&context->flags,&local_220);
  }
  if (local_3db != false) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_228,AllowUnboundedLiteral);
    bitmask<slang::ast::ASTFlags>::operator|=(&rightFlags,&local_228);
    bitmask<slang::ast::ASTFlags>::bitmask
              ((bitmask<slang::ast::ASTFlags> *)&left,AllowUnboundedLiteral);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_200,(bitmask<slang::ast::ASTFlags> *)&left);
  }
  pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->left);
  right = (Expression *)rightFlags.m_bits;
  local_238 = Expression::create(comp,pEVar10,(ASTContext *)&__range2,rightFlags,assignmentTarget);
  pEVar10 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->right);
  lt = (Type *)local_200.m_bits;
  local_248 = Expression::create(comp,pEVar10,context,local_200,assignmentTarget);
  bVar5 = Expression::bad(local_238);
  local_422 = true;
  if (!bVar5) {
    local_422 = Expression::bad(local_248);
  }
  rt = not_null::operator_cast_to_Type_((not_null *)&local_238->type);
  resultType = not_null::operator_cast_to_Type_((not_null *)&local_248->type);
  bVar5 = Type::isUnbounded(rt);
  if (bVar5) {
    rt = Compilation::getIntType(comp);
  }
  bVar5 = Type::isUnbounded(resultType);
  if (bVar5) {
    resultType = Compilation::getIntType(comp);
  }
  args = (ConditionalExpression *)Expression::binaryOperatorType(comp,rt,resultType,bVar6,false);
  result = args;
  iVar7 = SmallVectorBase<slang::ast::ConditionalExpression::Condition>::copy
                    ((SmallVectorBase<slang::ast::ConditionalExpression::Condition> *)
                     &trueContext.assertionInstance,(EVP_PKEY_CTX *)comp,src);
  args_2 = local_238;
  args_3 = local_248;
  local_280.data_ = (pointer)CONCAT44(extraout_var_00,iVar7);
  _auStack_290 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  local_270 = (Compilation *)
              BumpAllocator::
              emplace<slang::ast::ConditionalExpression,slang::ast::Type_const&,nonstd::span_lite::span<slang::ast::ConditionalExpression::Condition,18446744073709551615ul>,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
                        (&comp->super_BumpAllocator,(Type *)args,&local_280,args_2,args_3,
                         (SourceRange *)auStack_290);
  if (bVar3 || local_422 != false) {
    comp_local = (Compilation *)Expression::badExpr(comp,(Expression *)local_270);
    goto LAB_0068c9f5;
  }
  local_295 = 1;
  bVar6 = Type::isNumeric(rt);
  if (bVar6) {
    bVar6 = Type::isNumeric(resultType);
    if (!bVar6) goto LAB_0068c342;
  }
  else {
LAB_0068c342:
    bVar6 = Type::isNull(rt);
    if (bVar6) {
      bVar6 = Type::isNull(resultType);
      if (bVar6) {
        local_2a8 = Compilation::getNullType(comp);
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
                  ((not_null<slang::ast::Type_const*> *)&local_2a0,&local_2a8);
        (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2a0;
        goto LAB_0068c835;
      }
    }
    bVar6 = Type::isClass(rt);
    if (!bVar6) {
      bVar6 = Type::isClass(resultType);
      if (!bVar6) {
        bVar6 = Type::isCHandle(rt);
        if (!bVar6) {
          bVar6 = Type::isCHandle(resultType);
          if (!bVar6) {
            bVar6 = Type::isEvent(rt);
            if (!bVar6) {
              bVar6 = Type::isEvent(resultType);
              if (!bVar6) {
                bVar6 = Type::isVirtualInterface(rt);
                if (!bVar6) {
                  bVar6 = Type::isVirtualInterface(resultType);
                  if (!bVar6) {
                    bVar6 = Type::isCovergroup(rt);
                    if (!bVar6) {
                      bVar6 = Type::isCovergroup(resultType);
                      if (!bVar6) {
                        bVar6 = Type::isEquivalent(rt,resultType);
                        if (bVar6) {
                          bVar6 = Type::isUnpackedUnion(rt);
                          if (!bVar6) {
                            not_null<slang::ast::Type_const*>::
                            not_null<slang::ast::Type_const*&,void>
                                      ((not_null<slang::ast::Type_const*> *)&local_2e8,&rt);
                            (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2e8;
                            goto LAB_0068c835;
                          }
                        }
                        bVar6 = Expression::isImplicitString(local_238);
                        if (bVar6) {
                          bVar6 = Expression::isImplicitString(local_248);
                          if (bVar6) {
                            diag = (Diagnostic *)Compilation::getStringType(comp);
                            not_null<slang::ast::Type_const*>::
                            not_null<slang::ast::Type_const*,void>
                                      ((not_null<slang::ast::Type_const*> *)&local_2f0,
                                       (Type **)&diag);
                            (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2f0;
                            goto LAB_0068c835;
                          }
                        }
                        local_295 = 0;
                        goto LAB_0068c835;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar6 = Type::isNull(rt);
    if (bVar6) {
      not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                ((not_null<slang::ast::Type_const*> *)&local_2b0,&resultType);
      (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2b0;
    }
    else {
      bVar6 = Type::isNull(resultType);
      if (bVar6) {
        not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                  ((not_null<slang::ast::Type_const*> *)&local_2b8,&rt);
        (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2b8;
      }
      else {
        bVar6 = Type::isAssignmentCompatible(resultType,rt);
        if (bVar6) {
          not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                    ((not_null<slang::ast::Type_const*> *)&local_2c0,&resultType);
          (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2c0;
        }
        else {
          bVar6 = Type::isAssignmentCompatible(rt,resultType);
          if (bVar6) {
            not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                      ((not_null<slang::ast::Type_const*> *)&common,&rt);
            (((Expression *)&local_270->super_BumpAllocator)->type).ptr = common;
          }
          else {
            local_2d0 = Type::getCommonBase(rt,resultType);
            if (local_2d0 == (Type *)0x0) {
              bVar6 = Type::isEquivalent(rt,resultType);
              if (bVar6) {
                not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                          ((not_null<slang::ast::Type_const*> *)&local_2e0,&rt);
                (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2e0;
              }
              else {
                local_295 = 0;
              }
            }
            else {
              not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*&,void>
                        ((not_null<slang::ast::Type_const*> *)&local_2d8,&local_2d0);
              (((Expression *)&local_270->super_BumpAllocator)->type).ptr = local_2d8;
            }
          }
        }
      }
    }
  }
LAB_0068c835:
  expr = local_270;
  if ((local_295 & 1) == 0) {
    location = parsing::Token::location(&syntax->question);
    diag_00 = ASTContext::addDiag(context,(DiagCode)0x200007,location);
    diag_01 = ast::operator<<(diag_00,rt);
    ast::operator<<(diag_01,resultType);
    Diagnostic::operator<<(diag_00,local_238->sourceRange);
    Diagnostic::operator<<(diag_00,local_248->sourceRange);
    comp_local = (Compilation *)Expression::badExpr(comp,(Expression *)local_270);
  }
  else {
    syntax_00 = slang::syntax::SyntaxList::operator_cast_to_span((SyntaxList *)&syntax->attributes);
    ASTContext::setAttributes(context,(Expression *)expr,syntax_00);
    comp_local = local_270;
  }
LAB_0068c9f5:
  local_294 = 1;
  SmallVector<slang::ast::ConditionalExpression::Condition,_2UL>::~SmallVector
            ((SmallVector<slang::ast::ConditionalExpression::Condition,_2UL> *)
             &trueContext.assertionInstance);
  return (Expression *)comp_local;
}

Assistant:

Expression& ConditionalExpression::fromSyntax(Compilation& comp,
                                              const ConditionalExpressionSyntax& syntax,
                                              const ASTContext& context,
                                              const Type* assignmentTarget) {
    bool bad = false;
    bool isConst = true;
    bool isTrue = true;
    bool isFourState = false;
    SmallVector<Condition> conditions;
    ASTContext trueContext = context;

    for (auto condSyntax : syntax.predicate->conditions) {
        auto& cond = selfDetermined(comp, *condSyntax->expr, trueContext);
        bad |= cond.bad();

        const Pattern* pattern = nullptr;
        if (condSyntax->matchesClause) {
            Pattern::VarMap patternVarMap;
            pattern = &Pattern::bind(*condSyntax->matchesClause->pattern, *cond.type, patternVarMap,
                                     trueContext);

            // We don't consider the condition to be const if there's a pattern.
            isConst = false;
            bad |= pattern->bad();
        }
        else {
            isFourState |= cond.type->isFourState();
            if (!bad && !trueContext.requireBooleanConvertible(cond))
                bad = true;
        }

        if (!bad && isConst) {
            ConstantValue condVal = trueContext.tryEval(cond);
            if (!condVal || (condVal.isInteger() && condVal.integer().hasUnknown()))
                isConst = false;
            else if (!condVal.isTrue())
                isTrue = false;
        }

        conditions.push_back({&cond, pattern});
    }

    // If the predicate is known at compile time, we can tell which branch will be unevaluated.
    bitmask<ASTFlags> leftFlags = ASTFlags::None;
    bitmask<ASTFlags> rightFlags = ASTFlags::None;
    if (isConst) {
        if (isTrue)
            rightFlags = ASTFlags::UnevaluatedBranch;
        else
            leftFlags = ASTFlags::UnevaluatedBranch;
    }

    // Pass through the flag allowing unbounded literals.
    if (context.flags.has(ASTFlags::AllowUnboundedLiteral) &&
        context.flags.has(ASTFlags::AllowUnboundedLiteralArithmetic)) {
        leftFlags |= ASTFlags::AllowUnboundedLiteral;
        rightFlags |= ASTFlags::AllowUnboundedLiteral;
    }

    auto& left = create(comp, *syntax.left, trueContext, leftFlags, assignmentTarget);
    auto& right = create(comp, *syntax.right, context, rightFlags, assignmentTarget);
    bad |= left.bad() || right.bad();

    const Type* lt = left.type;
    const Type* rt = right.type;
    if (lt->isUnbounded())
        lt = &comp.getIntType();
    if (rt->isUnbounded())
        rt = &comp.getIntType();

    // Force four-state return type for ambiguous condition case.
    const Type* resultType = binaryOperatorType(comp, lt, rt, isFourState);
    auto result = comp.emplace<ConditionalExpression>(*resultType, conditions.copy(comp), left,
                                                      right, syntax.sourceRange());
    if (bad)
        return badExpr(comp, result);

    // If both sides of the expression are numeric, we've already determined the correct
    // result type. Otherwise, follow the rules in [11.14.11].
    bool good = true;
    if (!lt->isNumeric() || !rt->isNumeric()) {
        if (lt->isNull() && rt->isNull()) {
            result->type = &comp.getNullType();
        }
        else if (lt->isClass() || rt->isClass() || lt->isCHandle() || rt->isCHandle() ||
                 lt->isEvent() || rt->isEvent() || lt->isVirtualInterface() ||
                 rt->isVirtualInterface() || lt->isCovergroup() || rt->isCovergroup()) {
            if (lt->isNull())
                result->type = rt;
            else if (rt->isNull())
                result->type = lt;
            else if (rt->isAssignmentCompatible(*lt))
                result->type = rt;
            else if (lt->isAssignmentCompatible(*rt))
                result->type = lt;
            else if (auto common = Type::getCommonBase(*lt, *rt))
                result->type = common;
            else if (lt->isEquivalent(*rt))
                result->type = lt;
            else
                good = false;
        }
        else if (lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
            result->type = lt;
        }
        else if (left.isImplicitString() && right.isImplicitString()) {
            result->type = &comp.getStringType();
        }
        else {
            good = false;
        }
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadConditionalExpression, syntax.question.location());
        diag << *lt << *rt;
        diag << left.sourceRange;
        diag << right.sourceRange;
        return badExpr(comp, result);
    }

    context.setAttributes(*result, syntax.attributes);
    return *result;
}